

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O3

void __thiscall module_level_csv_actions::begin(module_level_csv_actions *this)

{
  ostream *poVar1;
  
  if (s_csv_table_marker == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[Levels]\n",9);
  }
  if (s_csv_table_header != '\0') {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Level",5);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,s_csv_separator_abi_cxx11_._M_dataplus._M_p,
                      s_csv_separator_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Module",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,s_csv_separator_abi_cxx11_._M_dataplus._M_p,
                      s_csv_separator_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Dependencies",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void begin()
    {
        if( s_csv_table_marker )
            std::cout << "[Levels]\n";
        if( s_csv_table_header )
            std::cout << "Level" << s_csv_separator << "Module" << s_csv_separator << "Dependencies" << "\n";
    }